

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

int32_t __thiscall icu_63::FCDUTF16CollationIterator::getOffset(FCDUTF16CollationIterator *this)

{
  FCDUTF16CollationIterator *this_local;
  
  if ((this->checkDir == '\0') && ((this->super_UTF16CollationIterator).start != this->segmentStart)
     ) {
    if ((this->super_UTF16CollationIterator).pos == (this->super_UTF16CollationIterator).start) {
      this_local._4_4_ = (int32_t)((long)this->segmentStart - (long)this->rawStart >> 1);
    }
    else {
      this_local._4_4_ = (int32_t)((long)this->segmentLimit - (long)this->rawStart >> 1);
    }
  }
  else {
    this_local._4_4_ =
         (int32_t)((long)(this->super_UTF16CollationIterator).pos - (long)this->rawStart >> 1);
  }
  return this_local._4_4_;
}

Assistant:

int32_t
FCDUTF16CollationIterator::getOffset() const {
    if(checkDir != 0 || start == segmentStart) {
        return (int32_t)(pos - rawStart);
    } else if(pos == start) {
        return (int32_t)(segmentStart - rawStart);
    } else {
        return (int32_t)(segmentLimit - rawStart);
    }
}